

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filesystem-disk-unix.c++
# Opt level: O2

Own<kj::Directory::Replacer<kj::File>,_std::nullptr_t> __thiscall
kj::anon_unknown_9::DiskDirectory::replaceFile(DiskDirectory *this,PathPtr path,WriteMode mode)

{
  File *pFVar1;
  undefined8 *puVar2;
  uint uVar3;
  undefined4 in_register_0000000c;
  Replacer<kj::File> *extraout_RDX;
  WriteMode in_R8D;
  size_t *this_00;
  PathPtr finalName;
  Own<kj::Directory::Replacer<kj::File>,_std::nullptr_t> OVar4;
  OwnFd local_c4;
  OwnFd local_c0;
  int newFd_;
  Own<kj::File,_std::nullptr_t> local_b8;
  Array<char> local_a8;
  String temp;
  uint local_64;
  Own<kj::Function<int_(kj::StringPtr)>::Iface,_std::nullptr_t> local_60;
  PathPtr local_50;
  Own<const_kj::File,_std::nullptr_t> local_40;
  
  finalName.parts.size_ = CONCAT44(in_register_0000000c,mode);
  finalName.parts.ptr = (String *)path.parts.size_;
  this_00 = &((path.parts.ptr)->content).size_;
  uVar3 = 0x1ff;
  if ((in_R8D & EXECUTABLE) == 0) {
    uVar3 = 0x1b6;
  }
  local_64 = uVar3 & 0xffffffc0;
  if ((in_R8D & PRIVATE) == 0) {
    local_64 = uVar3;
  }
  local_50.parts.ptr = finalName.parts.ptr;
  local_50.parts.size_ = finalName.parts.size_;
  local_60.ptr = (Iface *)operator_new(0x20);
  (local_60.ptr)->_vptr_Iface = (_func_int **)&PTR_operator___00260908;
  local_60.ptr[1]._vptr_Iface = (_func_int **)&newFd_;
  local_60.ptr[2]._vptr_Iface = (_func_int **)this_00;
  local_60.ptr[3]._vptr_Iface = (_func_int **)&local_64;
  local_60.disposer =
       (Disposer *)
       &_::
        HeapDisposer<kj::Function<int(kj::StringPtr)>::Impl<kj::(anonymous_namespace)::DiskHandle::replaceFile(kj::PathPtr,kj::WriteMode)const::{lambda(kj::StringPtr)#1}>>
        ::instance;
  DiskHandle::createNamedTemporary
            (&temp,(DiskHandle *)this_00,finalName,in_R8D,(Function<int_(kj::StringPtr)> *)&local_60
            );
  Own<kj::Function<int_(kj::StringPtr)>::Iface,_std::nullptr_t>::dispose(&local_60);
  local_c4.fd = newFd_;
  local_c0.fd = -1;
  newDiskFile((kj *)&local_b8,&local_c4);
  PathPtr::toString((String *)&local_a8,&local_50,false);
  puVar2 = (undefined8 *)operator_new(0x60);
  pFVar1 = local_b8.ptr;
  local_40.disposer = local_b8.disposer;
  local_b8.ptr = (File *)0x0;
  *(WriteMode *)(puVar2 + 1) = in_R8D;
  *puVar2 = &PTR_get_00260970;
  puVar2[2] = local_b8.disposer;
  puVar2[3] = pFVar1;
  local_40.ptr = (File *)0x0;
  puVar2[4] = this_00;
  puVar2[5] = temp.content.ptr;
  puVar2[6] = temp.content.size_;
  puVar2[7] = temp.content.disposer;
  temp.content.ptr = (char *)0x0;
  temp.content.size_ = 0;
  puVar2[8] = local_a8.ptr;
  puVar2[9] = local_a8.size_;
  puVar2[10] = local_a8.disposer;
  local_a8.ptr = (char *)0x0;
  local_a8.size_ = 0;
  *(undefined1 *)(puVar2 + 0xb) = 0;
  Own<const_kj::File,_std::nullptr_t>::dispose(&local_40);
  (this->super_Directory).super_ReadableDirectory.super_FsNode._vptr_FsNode =
       (_func_int **)
       &_::HeapDisposer<kj::(anonymous_namespace)::DiskHandle::ReplacerImpl<kj::File>>::instance;
  *(undefined8 **)&this->super_DiskHandle = puVar2;
  Array<char>::~Array(&local_a8);
  Own<kj::File,_std::nullptr_t>::dispose(&local_b8);
  OwnFd::~OwnFd(&local_c4);
  OwnFd::~OwnFd(&local_c0);
  Array<char>::~Array(&temp.content);
  OVar4.ptr = extraout_RDX;
  OVar4.disposer = (Disposer *)this;
  return OVar4;
}

Assistant:

Own<Replacer<File>> replaceFile(PathPtr path, WriteMode mode) const override {
    return DiskHandle::replaceFile(path, mode);
  }